

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O0

int x25519_set_pub_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  void *dst;
  X25519_KEY *key;
  size_t len_local;
  uint8_t *in_local;
  EVP_PKEY *pkey_local;
  
  if (len == 0x20) {
    dst = OPENSSL_malloc(0x41);
    if (dst == (void *)0x0) {
      pkey_local._4_4_ = 0;
    }
    else {
      OPENSSL_memcpy(dst,in,0x20);
      *(undefined1 *)((long)dst + 0x40) = 0;
      x25519_free(pkey);
      pkey->pkey = dst;
      pkey_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,0x36);
    pkey_local._4_4_ = 0;
  }
  return pkey_local._4_4_;
}

Assistant:

static int x25519_set_pub_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  X25519_KEY *key =
      reinterpret_cast<X25519_KEY *>(OPENSSL_malloc(sizeof(X25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  OPENSSL_memcpy(key->pub, in, 32);
  key->has_private = 0;

  x25519_free(pkey);
  pkey->pkey = key;
  return 1;
}